

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_TreeFilterOne(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  byte bVar6;
  int iVar7;
  void *__s;
  void *__s_00;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  Gia_Obj_t *pGVar11;
  size_t __n;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  
  iVar17 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar17 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar17 * 4);
  }
  __n = (long)iVar17 << 2;
  __s_00 = (void *)0x0;
  memset(__s,0,__n);
  if (iVar17 != 0) {
    __s_00 = malloc(__n);
  }
  iVar17 = iVar17 * 0x20;
  memset(__s_00,0,__n);
  iVar7 = vTree->nSize;
  if (1 < iVar7) {
    piVar4 = vTree->pArray;
    lVar16 = 0;
    do {
      iVar2 = piVar4[lVar16];
      if (iVar2 < 0) goto LAB_0067c1bc;
      uVar8 = iVar2 * 6 + 3;
      iVar3 = vAdds->nSize;
      if (iVar3 <= (int)uVar8) goto LAB_0067c1bc;
      piVar5 = vAdds->pArray;
      uVar8 = piVar5[uVar8];
      if (((int)uVar8 < 0) || (iVar17 <= (int)uVar8)) goto LAB_0067c1db;
      puVar1 = (uint *)((long)__s + (ulong)(uVar8 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar8 & 0x1f);
      uVar8 = iVar2 * 6 + 4;
      if (iVar3 <= (int)uVar8) goto LAB_0067c1bc;
      uVar8 = piVar5[uVar8];
      if (((int)uVar8 < 0) || (iVar17 <= (int)uVar8)) goto LAB_0067c1db;
      puVar1 = (uint *)((long)__s + (ulong)(uVar8 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar8 & 0x1f);
      iVar2 = (int)lVar16;
      lVar16 = lVar16 + 2;
    } while (iVar2 + 3 < iVar7);
  }
  iVar7 = vTree->nSize;
  if (1 < iVar7) {
    piVar4 = vTree->pArray;
    lVar16 = 0;
    do {
      iVar2 = piVar4[lVar16];
      if (iVar2 < 0) goto LAB_0067c1bc;
      uVar12 = iVar2 * 6;
      uVar8 = vAdds->nSize;
      if (uVar8 == uVar12 || SBORROW4(uVar8,uVar12) != (int)(uVar8 + iVar2 * -6) < 0)
      goto LAB_0067c1bc;
      piVar5 = vAdds->pArray;
      uVar10 = piVar5[uVar12];
      if (((int)uVar10 < 0) || (iVar17 <= (int)uVar10)) goto LAB_0067c1db;
      bVar6 = (byte)uVar10 & 0x1f;
      puVar1 = (uint *)((long)__s + (ulong)(uVar10 >> 5) * 4);
      *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      if ((int)uVar8 <= (int)(uVar12 | 1)) goto LAB_0067c1bc;
      uVar10 = piVar5[uVar12 | 1];
      if (((int)uVar10 < 0) || (iVar17 <= (int)uVar10)) goto LAB_0067c1db;
      bVar6 = (byte)uVar10 & 0x1f;
      puVar1 = (uint *)((long)__s + (ulong)(uVar10 >> 5) * 4);
      *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      if ((int)uVar8 <= (int)(uVar12 + 2)) goto LAB_0067c1bc;
      uVar8 = piVar5[uVar12 + 2];
      if (((int)uVar8 < 0) || (iVar17 <= (int)uVar8)) goto LAB_0067c1db;
      bVar6 = (byte)uVar8 & 0x1f;
      puVar1 = (uint *)((long)__s + (ulong)(uVar8 >> 5) * 4);
      *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      iVar2 = (int)lVar16;
      lVar16 = lVar16 + 2;
    } while (iVar2 + 3 < iVar7);
  }
  uVar8 = p->nObjs;
  if ((0 < (int)uVar8) && (pGVar11 = p->pObjs, pGVar11 != (Gia_Obj_t *)0x0)) {
    uVar9 = 0;
    do {
      uVar12 = (uint)*(undefined8 *)pGVar11;
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        uVar14 = -(uVar12 & 0x1fffffff) + uVar9;
        uVar12 = (uint)uVar14;
        if (((int)uVar12 < 0) || (iVar17 <= (int)uVar12)) goto LAB_0067c1fa;
        uVar14 = uVar14 >> 5 & 0x7ffffff;
        if ((*(uint *)((long)__s + uVar14 * 4) >> (uVar12 & 0x1f) & 1) == 0) {
          uVar13 = -((uint)((ulong)*(undefined8 *)pGVar11 >> 0x20) & 0x1fffffff) + uVar9;
          uVar10 = (uint)uVar13;
          if (((int)uVar10 < 0) || (iVar17 <= (int)uVar10)) goto LAB_0067c1fa;
          uVar13 = uVar13 >> 5 & 0x7ffffff;
          if (((*(uint *)((long)__s + uVar13 * 4) >> (uVar10 & 0x1f) & 1) == 0) &&
             (((*(uint *)((long)__s_00 + uVar14 * 4) >> (uVar12 & 0x1f) & 1) == 0 &&
              ((*(uint *)((long)__s_00 + uVar13 * 4) >> (uVar10 & 0x1f) & 1) == 0))))
          goto LAB_0067c037;
        }
        if ((long)iVar17 <= (long)uVar9) {
LAB_0067c1db:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s_00 + (uVar9 >> 5 & 0x7ffffff) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
      }
LAB_0067c037:
      uVar9 = uVar9 + 1;
      pGVar11 = pGVar11 + 1;
    } while (uVar8 != uVar9);
  }
  iVar7 = vTree->nSize;
  uVar8 = 0;
  if (1 < iVar7) {
    lVar16 = 1;
    uVar8 = 0;
    do {
      piVar4 = vTree->pArray;
      uVar12 = piVar4[lVar16 + -1];
      if ((int)uVar12 < 0) {
LAB_0067c1bc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = uVar12 * 6 + 3;
      iVar2 = vAdds->nSize;
      if (iVar2 <= (int)uVar10) goto LAB_0067c1bc;
      piVar5 = vAdds->pArray;
      uVar10 = piVar5[uVar10];
      if (((int)uVar10 < 0) || (iVar17 <= (int)uVar10)) goto LAB_0067c1fa;
      iVar3 = piVar4[lVar16];
      if ((*(uint *)((long)__s_00 + (ulong)(uVar10 >> 5) * 4) >> (uVar10 & 0x1f) & 1) == 0) {
        uVar15 = uVar12 * 6 + 4;
        if (iVar2 <= (int)uVar15) goto LAB_0067c1bc;
        uVar15 = piVar5[uVar15];
        if (((int)uVar15 < 0) || (iVar17 <= (int)uVar15)) {
LAB_0067c1fa:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)__s_00 + (ulong)(uVar15 >> 5) * 4) >> (uVar15 & 0x1f) & 1) != 0)
        goto LAB_0067c112;
        if (((int)uVar8 < 0) || (iVar7 <= (int)uVar8)) {
LAB_0067c219:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar10 = uVar8 + 1;
        piVar4[uVar8] = uVar12;
        if (vTree->nSize <= (int)uVar10) goto LAB_0067c219;
        uVar8 = uVar8 + 2;
        piVar4[uVar10] = iVar3;
      }
      else {
LAB_0067c112:
        uVar15 = uVar12 * 6 + 4;
        if (iVar2 <= (int)uVar15) goto LAB_0067c1bc;
        printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)uVar12,(ulong)uVar10,
               (ulong)(uint)piVar5[uVar15]);
      }
      iVar7 = vTree->nSize;
      lVar16 = lVar16 + 2;
    } while ((int)lVar16 < iVar7);
  }
  if (iVar7 < (int)uVar8) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vTree->nSize = uVar8;
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 == (void *)0x0) {
    return;
  }
  free(__s_00);
  return;
}

Assistant:

void Acec_TreeFilterOne( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+0), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+1), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+2), 0 );
    }
    // iterate through nodes to detect TFO of roots
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_BitEntry(vIsRoot, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vIsRoot, Gia_ObjFaninId1(pObj,i)) ||
             Vec_BitEntry(vMarked, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vMarked, Gia_ObjFaninId1(pObj,i)) )
            Vec_BitWriteEntry( vMarked, i, 1 );
    }
    // remove those that overlap with roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        // special case of the first bit
//        if ( i == 0 )
//            continue;

/*
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 24 && Vec_IntEntry(vAdds, 6*Box+4) == 22 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 48 && Vec_IntEntry(vAdds, 6*Box+4) == 49 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
*/
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsRoot );
    Vec_BitFree( vMarked );
}